

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

bool __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::contains
          (Set<SAT::SATLiteral,_Lib::DefaultHash> *this,SATLiteral val)

{
  bool bVar1;
  Cell *this_00;
  Set<SAT::SATLiteral,_Lib::DefaultHash> *in_RDI;
  Cell *cell;
  uint code;
  uint local_14;
  
  local_14 = DefaultHash::hash<SAT::SATLiteral>((SATLiteral *)0x7c43d0);
  if (local_14 < 2) {
    local_14 = 2;
  }
  this_00 = firstCellForCode(in_RDI,local_14);
  while( true ) {
    bVar1 = Cell::empty(this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    bVar1 = Cell::deleted(this_00);
    if (((!bVar1) && (this_00->code == local_14)) &&
       (bVar1 = DefaultHash::equals<SAT::SATLiteral>((SATLiteral *)this_00,(SATLiteral *)in_RDI),
       bVar1)) break;
    this_00 = nextCell(in_RDI,this_00);
  }
  return true;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }